

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int __thiscall ON_SubD::SolidOrientation(ON_SubD *this)

{
  ON_SubDLevel *this_00;
  int local_18;
  bool local_13;
  bool local_12;
  bool local_11;
  int solid_orientation;
  bool bHasBoundary;
  bool bIsOriented;
  bool bIsManifold;
  ON_SubD *this_local;
  
  local_11 = false;
  local_12 = false;
  local_13 = false;
  local_18 = 0;
  _solid_orientation = this;
  this_00 = ActiveLevel(this);
  ON_SubDLevel::GetTopologicalAttributes(this_00,&local_11,&local_12,&local_13,&local_18);
  return local_18;
}

Assistant:

int ON_SubD::SolidOrientation() const
{
  bool bIsManifold = false;
  bool bIsOriented = false;
  bool bHasBoundary = false;
  int solid_orientation = 0;
  ActiveLevel().GetTopologicalAttributes(bIsManifold, bIsOriented, bHasBoundary, solid_orientation);
  return solid_orientation;
}